

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v4.cpp
# Opt level: O3

error_handler_result __thiscall
error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
::operator()(error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
             *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *first,
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *last,expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *x,context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>
                     *context)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  long *plVar5;
  ostream *poVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  string message;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = last;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR! : ",9);
  pcVar3 = (char *)(**(code **)(*(long *)x + 0x10))(x);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1110f8);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pcVar1 = (x->which_)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (x->which_)._M_string_length);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10c26f);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_88 = *plVar7;
    lStack_80 = plVar5[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar7;
    local_98 = (long *)*plVar5;
  }
  local_90 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_70 = &local_60;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  pcVar3 = first->_M_current;
  pcVar2 = (x->where_)._M_current;
  uVar9 = 0;
  iVar10 = 0;
  if (pcVar3 != pcVar2) {
    iVar10 = (int)pcVar2 - (int)pcVar3;
    do {
      local_98 = (long *)CONCAT71(local_98._1_7_,*pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != pcVar2);
  }
  if (local_78->_M_current != pcVar2) {
    uVar8 = 0;
    do {
      pcVar3 = pcVar2 + 1;
      local_98 = (long *)CONCAT71(local_98._1_7_,*pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      uVar9 = uVar8 + 1;
      if (8 < uVar8) break;
      uVar8 = uVar9;
      pcVar2 = pcVar3;
    } while (pcVar3 != local_78->_M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (0 < iVar10) {
    iVar10 = iVar10 + 1;
    do {
      local_98 = (long *)CONCAT71(local_98._1_7_,0x2d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^",1);
  if (1 < (int)uVar9) {
    iVar10 = uVar9 + 1;
    do {
      local_98 = (long *)CONCAT71(local_98._1_7_,0x2d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      iVar10 = iVar10 + -1;
    } while (2 < iVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  return fail;
}

Assistant:

x3::error_handler_result operator() (
      Iterator const& first, Iterator const& last, Exception const& x,
      Context const& context) {

      std::cout << "ERROR! : " << x.what() << "\n";
      std::string message = "Error! Expecting: " + x.which() + " here:";
      std::cout << message << "\n";

      auto curr = first;
      auto iter = x.where();

      int prefix_size = 0;
      while ( curr != iter ) {
         std::cout << *curr;
         ++prefix_size;
         ++curr;
      }

      int char_count = 0;
      for (;char_count < 10; ++char_count) {
         if (iter == last) break;
         std::cout << *iter;
         ++iter;
      }
      std::cout << "\n";
      for (; prefix_size > 0; --prefix_size) {
         std::cout << '-';
      }

      std::cout << "^";
      for (; char_count > 1; --char_count){
         std::cout << '-';
      }
      std::cout << "\n";

      return x3::error_handler_result::fail;


   }